

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Object * __thiscall ICM::Interpreter::run(Interpreter *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  Ty<6UL> TVar1;
  bool bVar2;
  Instruction IVar3;
  int iVar4;
  time_t tVar5;
  reference ppIVar6;
  size_t __n;
  undefined4 extraout_var;
  Object *pOVar7;
  Ty<14UL> *this_00;
  TypeUnit type;
  undefined4 extraout_var_00;
  reference ppOVar8;
  Ty<6UL> *pTVar9;
  Ty<8UL> *pTVar10;
  Ty<8UL> *pTVar11;
  Object **e_00;
  undefined4 extraout_var_01;
  value_type pOVar12;
  lightlist<ICM::Object_*> *dl;
  string *first;
  uint *puVar13;
  void *__child_stack;
  void *__child_stack_00;
  void *extraout_RDX;
  void *__child_stack_01;
  void *extraout_RDX_00;
  __fn *__fn;
  value_type pIVar14;
  void *in_R8;
  string local_190;
  Object *local_170;
  Object *op_1;
  Element *e;
  iterator __end4_1;
  iterator __begin4_1;
  vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_> *__range4_1;
  PrintIdent *inst_11;
  ListType local_138;
  Object *local_120;
  Object *local_118;
  Object *p;
  Object **__end4;
  Object **__begin4;
  DataList *__range4;
  undefined1 local_e8 [8];
  lightlist_creater<ICM::Object_*> llc;
  DataList v;
  List *inst_10;
  bool r_1;
  Ty<8UL> *n2;
  Ty<8UL> *n1;
  JumpCompare *inst_9;
  Inc *inst_8;
  bool r;
  Object *op;
  JumpNot *inst_7;
  Jump *inst_6;
  Store *inst_5;
  CopySingle *inst_4;
  Object *data;
  Assign *inst_3;
  Assign *inst_2;
  Assign *inst_1;
  CheckCall *inst;
  value_type *Inst;
  size_t ProgramCounter;
  Interpreter *this_local;
  
  Inst = (value_type *)0x0;
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
LAB_00197562:
  ppIVar6 = std::
            vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ::operator[](&this->InstList->
                          super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                         ,(size_type)Inst);
  IVar3 = Instruction::InstructionData::inst(*ppIVar6);
  puVar13 = &switchD_001975ae::switchdataD_001e5bc0;
  iVar4 = 0x1e5bc0;
  switch(IVar3) {
  case end:
    goto switchD_001975ae_caseD_1;
  case sing:
    pOVar12 = this->Result;
    ppOVar8 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                        (&this->TempResult,(size_type)Inst);
    *ppOVar8 = pOVar12;
    ppOVar8 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                        (&this->TempResult,(size_type)Inst);
    this->Result = *ppOVar8;
    break;
  case stor:
    pOVar7 = getObject(this,(Element *)(*ppIVar6 + 1));
    ppOVar8 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                        (&this->TempResult,(size_type)Inst);
    *ppOVar8 = pOVar7;
    ppOVar8 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                        (&this->TempResult,(size_type)Inst);
    this->Result = *ppOVar8;
    break;
  case list:
    __return_storage_ptr__ =
         &llc._data._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    createDataList((DataList *)__return_storage_ptr__,this,
                   (vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_> *)
                   (*ppIVar6 + 1));
    e_00 = (Object **)
           Common::lightlist<ICM::Object_*>::size
                     ((lightlist<ICM::Object_*> *)__return_storage_ptr__);
    Common::lightlist_creater<ICM::Object_*>::lightlist_creater
              ((lightlist_creater<ICM::Object_*> *)local_e8,(size_t)e_00);
    __begin4 = (Object **)
               &llc._data._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    __end4 = Common::lightlist<ICM::Object_*>::begin((lightlist<ICM::Object_*> *)__begin4);
    p = (Object *)Common::lightlist<ICM::Object_*>::end((lightlist<ICM::Object_*> *)__begin4);
    __child_stack_01 = extraout_RDX;
    for (; (Object *)__end4 != p; __end4 = __end4 + 1) {
      local_118 = *__end4;
      iVar4 = Object::clone(local_118,(__fn *)e_00,__child_stack_01,(int)puVar13,in_R8);
      local_120 = (Object *)CONCAT44(extraout_var_01,iVar4);
      e_00 = &local_120;
      Common::lightlist_creater<ICM::Object_*>::push_back
                ((lightlist_creater<ICM::Object_*> *)local_e8,e_00);
      __child_stack_01 = extraout_RDX_00;
    }
    pOVar12 = (value_type)operator_new(0x10);
    dl = Common::lightlist_creater<ICM::Object_*>::data
                   ((lightlist_creater<ICM::Object_*> *)local_e8);
    TypeBase::ListType::ListType(&local_138,dl);
    Objects::DataObject<(ICM::DefaultType)17>::DataObject
              ((DataObject<(ICM::DefaultType)17> *)pOVar12,&local_138);
    ppOVar8 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                        (&this->TempResult,(size_type)Inst);
    *ppOVar8 = pOVar12;
    TypeBase::ListType::~ListType(&local_138);
    ppOVar8 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                        (&this->TempResult,(size_type)Inst);
    this->Result = *ppOVar8;
    Common::lightlist_creater<ICM::Object_*>::~lightlist_creater
              ((lightlist_creater<ICM::Object_*> *)local_e8);
    Common::lightlist<ICM::Object_*>::~lightlist
              ((lightlist<ICM::Object_*> *)
               &llc._data._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    break;
  case pti:
    pIVar14 = *ppIVar6;
    __end4_1 = std::vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>::
               begin((vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>
                      *)(pIVar14 + 1));
    e = (Element *)
        std::vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>::end
                  ((vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_> *)
                   (pIVar14 + 1));
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end4_1,
                              (__normal_iterator<ICM::Instruction::Element_*,_std::vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>_>
                               *)&e), bVar2) {
      op_1 = (Object *)
             __gnu_cxx::
             __normal_iterator<ICM::Instruction::Element_*,_std::vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>_>
             ::operator*(&__end4_1);
      bVar2 = Instruction::Element::isIdentType((Element *)op_1,I_DyVarb);
      if (bVar2) {
        first = getIdentName_abi_cxx11_((Element *)op_1);
        print<std::__cxx11::string,char[2]>(first,(char (*) [2])0x1e65af);
      }
      local_170 = getObject(this,(Element *)op_1);
      if (local_170 == (Object *)0x0) {
        print("Null");
      }
      else {
        pOVar7 = getObject(this,(Element *)op_1);
        Object::to_string_abi_cxx11_(&local_190,pOVar7);
        print<std::__cxx11::string>(&local_190);
        std::__cxx11::string::~string((string *)&local_190);
      }
      bVar2 = Instruction::Element::isIdentType((Element *)op_1,I_DyVarb);
      if (bVar2) {
        print(")");
      }
      println();
      __gnu_cxx::
      __normal_iterator<ICM::Instruction::Element_*,_std::vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>_>
      ::operator++(&__end4_1);
    }
    break;
  case ccal:
    pOVar7 = CheckCall(this,(vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>
                             *)(*ppIVar6 + 1));
    ppOVar8 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                        (&this->TempResult,(size_type)Inst);
    *ppOVar8 = pOVar7;
    ppOVar8 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                        (&this->TempResult,(size_type)Inst);
    this->Result = *ppOVar8;
    break;
  case let:
  case cpy:
  case ref:
    pIVar14 = *ppIVar6;
    bVar2 = Instruction::Element::isLiteral((Element *)&pIVar14[1].Inst);
    if (bVar2) {
      pOVar7 = createObjectFromLiteral((Element *)&pIVar14[1].Inst,this->EP);
      setDyVarbData((IdentIndex *)&pIVar14->field_0xc,pOVar7);
    }
    else {
      bVar2 = Instruction::Element::isRefer((Element *)&pIVar14[1].Inst);
      if (bVar2) {
        __n = Instruction::Element::getRefer((Element *)&pIVar14[1].Inst);
        ppOVar8 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                            (&this->TempResult,__n);
        setDyVarbData((IdentIndex *)&pIVar14->field_0xc,*ppOVar8);
      }
      else {
        __fn = (__fn *)0x4;
        bVar2 = Instruction::Element::isIdentType((Element *)&pIVar14[1].Inst,I_DyVarb);
        if (bVar2) {
          IVar3 = Instruction::InstructionData::inst(*ppIVar6);
          if (IVar3 == let) {
            pOVar7 = getDyVarbData((Element *)&pIVar14[1].Inst);
            setDyVarbData((IdentIndex *)&pIVar14->field_0xc,pOVar7);
          }
          else if (IVar3 == cpy) {
            pOVar7 = getDyVarbData((Element *)&pIVar14[1].Inst);
            iVar4 = Object::clone(pOVar7,__fn,__child_stack,IVar3,in_R8);
            setDyVarbData((IdentIndex *)&pIVar14->field_0xc,(Object *)CONCAT44(extraout_var,iVar4));
          }
          else if (IVar3 == ref) {
            pOVar7 = getDyVarbData((Element *)&pIVar14[1].Inst);
            setDyVarbData((IdentIndex *)&pIVar14->field_0xc,pOVar7);
          }
        }
        else {
          bVar2 = Instruction::Element::isIdent((Element *)&pIVar14[1].Inst);
          if (bVar2) {
            pOVar7 = getIdentData((Element *)&pIVar14[1].Inst);
            setDyVarbData((IdentIndex *)&pIVar14->field_0xc,pOVar7);
          }
          else {
            println<char[17]>((char (*) [17])"Error in Assign.");
          }
        }
      }
    }
    break;
  case cpys:
    pIVar14 = *ppIVar6 + 1;
    pOVar7 = getObject(this,(Element *)pIVar14);
    iVar4 = Object::clone(pOVar7,(__fn *)pIVar14,__child_stack_00,iVar4,in_R8);
    ppOVar8 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                        (&this->TempResult,(size_type)Inst);
    *ppOVar8 = (value_type)CONCAT44(extraout_var_00,iVar4);
    ppOVar8 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                        (&this->TempResult,(size_type)Inst);
    this->Result = *ppOVar8;
    break;
  case inc:
    pOVar7 = getDyVarbData((IdentIndex *)&(*ppIVar6)->field_0xc);
    pTVar10 = Object::dat<8ul>(pOVar7);
    *pTVar10 = *pTVar10 + 1;
    break;
  case jump:
    Inst = (value_type *)(*ppIVar6)[1]._vptr_InstructionData;
    goto LAB_00197562;
  case jmpf:
  case jmpn:
    pIVar14 = *ppIVar6;
    pOVar7 = getObject(this,(Element *)(pIVar14 + 1));
    bVar2 = Object::isType(pOVar7,6);
    if (!bVar2) {
      println<char[18]>((char (*) [18])"Error Not Boolean");
      return (Object *)(Interpreter *)0x0;
    }
    pTVar9 = Object::dat<6ul>(pOVar7);
    TVar1 = *pTVar9;
    IVar3 = Instruction::InstructionData::inst(*ppIVar6);
    if (((IVar3 == jmpf) && ((TVar1 & 1U) != 0)) ||
       ((IVar3 = Instruction::InstructionData::inst(*ppIVar6), IVar3 == jmpn && ((TVar1 & 1U) == 0))
       )) {
      Inst = (value_type *)pIVar14[2]._vptr_InstructionData;
      goto LAB_00197562;
    }
    break;
  case jpsm:
  case jpse:
  case jpla:
  case jple:
    pIVar14 = *ppIVar6;
    pOVar7 = getDyVarbData((IdentIndex *)&pIVar14->field_0xc);
    pTVar10 = Object::dat<8ul>(pOVar7);
    pOVar7 = getObject(this,(Element *)&pIVar14[1].Inst);
    pTVar11 = Object::dat<8ul>(pOVar7);
    IVar3 = Instruction::InstructionData::inst(*ppIVar6);
    switch(IVar3) {
    case jpsm:
      bVar2 = *pTVar10 < *pTVar11;
      break;
    case jpse:
      bVar2 = *pTVar10 <= *pTVar11;
      break;
    case jpla:
      bVar2 = *pTVar11 < *pTVar10;
      break;
    case jple:
      bVar2 = *pTVar11 <= *pTVar10;
      break;
    default:
      bVar2 = false;
    }
    if (!bVar2) break;
    Inst = *(value_type **)&pIVar14[2].Inst;
    goto LAB_00197562;
  case dim:
    break;
  case rest:
    pIVar14 = *ppIVar6;
    pOVar7 = getObject(this,(Element *)&pIVar14[1].Inst);
    this_00 = Object::dat<14ul>(pOVar7);
    type = TypeBase::TypeType::get(this_00);
    setDyVarbRestType((IdentIndex *)&pIVar14->field_0xc,type);
  }
  Inst = (value_type *)((long)Inst + 1);
  goto LAB_00197562;
switchD_001975ae_caseD_1:
  return (Object *)(Interpreter *)this->Result;
}

Assistant:

Object* run() {
			size_t ProgramCounter = 0;
			std::srand(static_cast<unsigned>(std::time(0)));
			while (true) {
				using namespace Instruction;
				auto &Inst = InstList[ProgramCounter];
				//println(ProgramCounter, "| ", Inst->to_string());
				switch (Inst->inst()) {
				case ccal: {
					Insts::CheckCall &inst = static_cast<Insts::CheckCall&>(*Inst);
					TempResult[ProgramCounter] = CheckCall(inst.Data);
					Result = TempResult[ProgramCounter];
					break;
				}
						   /*case farg: {
						   Insts::FuncArgs &inst = static_cast<Insts::FuncArgs&>(*Inst);
						   Global.Func.Args = createDataList(inst.Args);
						   break;
						   }
						   case fargl: {
						   Insts::FuncArgsLight &inst = *static_cast<Insts::FuncArgsLight*>(Inst);
						   Global.Func.Args = inst.Args;
						   break;
						   }
						   case fargv: {
						   break;
						   }
						   case fsub: {
						   Insts::FuncSub &inst = static_cast<Insts::FuncSub&>(*Inst);
						   auto &args = Global.Func.Args;
						   auto &ftu = GlobalFunctionTable[inst.Func.index];
						   size_t id = getCallID(ftu, args);
						   if (id != ftu.size()) {
						   Global.Func.Func.index = inst.Func.index;
						   Global.Func.Func.subid = id;
						   }
						   else {
						   println("Error Unfind args match function ", ftu.getName(), ".");
						   Global.Func.Func.index = 0;
						   Global.Func.Func.subid = 0;
						   }
						   break;
						   }
						   case fsubr: {
						   break;
						   }
						   case fsubv: {
						   break;
						   }
						   case fcal: {
						   auto &args = Global.Func.Args;
						   auto &func = Global.Func.Func;
						   if (func.index == 0) {
						   println("Call Error");
						   return Result;
						   }
						   ObjectPtr &&op = GlobalFunctionTable[func.index][func.subid].call(args);
						   TempResult[ProgramCounter] = op.get();
						   Result = TempResult[ProgramCounter];
						   break;
						   }*/
				case let:
				case cpy:
				case ref: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					if (inst.Data.isLiteral()) {
						setDyVarbData(inst.VTU, createObjectFromLiteral(inst.Data, EP));
					}
					else if (inst.Data.isRefer()) {
						setDyVarbData(inst.VTU, TempResult[inst.Data.getRefer()]);
					}
					else if (inst.Data.isIdentType(I_DyVarb)) {
						switch (Inst->inst()) {
						case let:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data));
							break;
						case cpy:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data)->clone());
							break;
						case ref:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data)); // TODO
							break;
						}
					}
					else if (inst.Data.isIdent()) {
						setDyVarbData(inst.VTU, getIdentData(inst.Data));
					}
					else
						println("Error in Assign.");
					break;
				}
				case dim: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					break;
				}
				case rest: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					//(restrict a (type 5))
					Object *data = getObject(inst.Data);
					setDyVarbRestType(inst.VTU, data->dat<T_Type>().get());
					break;
				}
				case cpys: {
					Insts::CopySingle &inst = static_cast<Insts::CopySingle&>(*Inst);
					TempResult[ProgramCounter] = getObject(inst.Data)->clone(); // TODO
					Result = TempResult[ProgramCounter];
					break;
				}
				case stor: {
					Insts::Store &inst = static_cast<Insts::Store&>(*Inst);
					TempResult[ProgramCounter] = getObject(inst.Data); // TODO
					Result = TempResult[ProgramCounter];
					break;
				}
				case sing: {
					TempResult[ProgramCounter] = Result;
					Result = TempResult[ProgramCounter];
					break;
				}
				case jump: {
					Insts::Jump &inst = static_cast<Insts::Jump&>(*Inst);
					ProgramCounter = inst.Index;
					continue;
				}
				case jmpf:
				case jmpn: {
					Insts::JumpNot &inst = static_cast<Insts::JumpNot&>(*Inst);
					Object *op = getObject(inst.Data);
					if (op->isType(T_Boolean)) {
						bool r = op->dat<T_Boolean>();
						if ((Inst->inst() == jmpf && r) || (Inst->inst() == jmpn && !r)) {
							ProgramCounter = inst.Index;
							continue;
						}
					}
					else {
						println("Error Not Boolean");
						return nullptr;
					}
					break;
				}
				case inc: {
					Insts::Inc &inst = static_cast<Insts::Inc&>(*Inst);
					getDyVarbData(inst.VTU)->dat<T_Number>() += 1;
					break;
				}
				case jpsm:
				case jpse:
				case jpla:
				case jple: {
					Insts::JumpCompare &inst = static_cast<Insts::JumpCompare&>(*Inst);
					const auto &n1 = getDyVarbData(inst.VTU)->dat<T_Number>();
					const auto &n2 = getObject(inst.Data)->dat<T_Number>();
					bool r;
					switch (Inst->inst()) {
					case jpsm: r = n1 < n2; break;
					case jpse: r = n1 <= n2; break;
					case jpla: r = n1 > n2; break;
					case jple: r = n1 >= n2; break;
					default:   r = false;
					}
					if (r) {
						ProgramCounter = inst.Index;
						continue;
					}
					break;
				}
				case list: {
					Insts::List &inst = static_cast<Insts::List&>(*Inst);
					// TODO
					auto v = createDataList(inst.Data);
					lightlist_creater<Object*> llc(v.size());
					for (auto p : v) {
						llc.push_back(p->clone());
					}

					TempResult[ProgramCounter] = new Objects::List(TypeBase::ListType(llc.data()));
					Result = TempResult[ProgramCounter];
					break;
				}
				case pti: {
					Insts::PrintIdent &inst = static_cast<Insts::PrintIdent&>(*Inst);
					for (Element &e : inst.Args) {
						if (e.isIdentType(I_DyVarb))
							print(getIdentName(e), "(");
						Object *op = getObject(e);
						if (op)
							print(getObject(e)->to_string());
						else
							print("Null");
						if (e.isIdentType(I_DyVarb))
							print(")");
						println();
					}
					break;
				}
				case end: {
					return Result;
				}
				}
				ProgramCounter++;
			}
			return Result;
		}